

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O2

bool __thiscall
ON_PointGrid::GetTightBoundingBox
          (ON_PointGrid *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  undefined7 in_register_00000011;
  long lVar2;
  bool bVar3;
  long lVar4;
  
  if ((int)CONCAT71(in_register_00000011,bGrowBox) != 0) {
    bVar1 = ON_BoundingBox::IsValid(tight_bbox);
    bVar3 = true;
    if (bVar1) goto LAB_0059099a;
  }
  ON_BoundingBox::Destroy(tight_bbox);
  bVar3 = false;
LAB_0059099a:
  lVar4 = 0;
  for (lVar2 = 0; lVar2 < this->m_point_count[0]; lVar2 = lVar2 + 1) {
    bVar1 = ON_GetPointListBoundingBox
                      (3,false,this->m_point_count[1],3,
                       (double *)
                       ((long)&((this->m_point).super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar4),
                       tight_bbox,(uint)bVar3,xform);
    if (bVar1) {
      bVar3 = true;
    }
    lVar4 = lVar4 + 0x18;
  }
  return bVar3;
}

Assistant:

bool ON_PointGrid::GetTightBoundingBox(
         ON_BoundingBox& tight_bbox,
         bool bGrowBox,
				 const ON_Xform* xform 
         ) const
{
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }
  
  int i;
  for ( i = 0; i < m_point_count[0]; i++ )
  {
    if ( ON_GetPointListBoundingBox( 3, 0, m_point_count[1], 3, &m_point[i].x, tight_bbox, bGrowBox, xform ) )
      bGrowBox = true;
  }
  return bGrowBox?true:false;
}